

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

FDecalBase * FDecalLib::ScanTreeForName(char *name,FDecalBase *root)

{
  int iVar1;
  char *__s2;
  FDecalBase *pFStack_18;
  int lexx;
  FDecalBase *root_local;
  char *name_local;
  
  pFStack_18 = root;
  while( true ) {
    if (pFStack_18 == (FDecalBase *)0x0) {
      return (FDecalBase *)0x0;
    }
    __s2 = FName::operator_cast_to_char_(&pFStack_18->Name);
    iVar1 = strcasecmp(name,__s2);
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      pFStack_18 = pFStack_18->Left;
    }
    else {
      pFStack_18 = pFStack_18->Right;
    }
  }
  return pFStack_18;
}

Assistant:

FDecalBase *FDecalLib::ScanTreeForName (const char *name, FDecalBase *root)
{
	while (root != NULL)
	{
		int lexx = stricmp (name, root->Name);
		if (lexx == 0)
		{
			break;
		}
		else if (lexx < 0)
		{
			root = root->Left;
		}
		else
		{
			root = root->Right;
		}
	}
	return root;
}